

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

void set_top_object_offset_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Object local_60;
  int local_54;
  int y;
  int local_44;
  int val;
  Am_Ptr local_38;
  am_loc_values *loc_values;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object win;
  Am_Object *cmd_local;
  
  win.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(&local_18,0xfa,0);
  local_38 = Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object
            ((Am_Object *)&stack0xffffffffffffffc0,(Am_Slot_Key)&local_18,(ulong)Am_TOP_HOW);
  pAVar2 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc0,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  *(int *)((long)local_38 + 4) = iVar1;
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  local_44 = *(int *)((long)local_38 + 0x28);
  Am_Object::Get_Object
            ((Am_Object *)&stack0xffffffffffffffb0,(Am_Slot_Key)&local_18,
             (ulong)Am_TOP_AMOUNT_WIDGET);
  Am_Object::Set((Am_Object *)&stack0xffffffffffffffb0,0x169,local_44,0);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffb0);
  set_ref_grey(&local_18,false);
  pAVar2 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  switch(iVar1) {
  case 0x11:
    local_54 = 199;
    break;
  case 0x12:
    local_54 = 0xd5;
    break;
  case 0x13:
    local_54 = 0xfb;
    break;
  case 0x14:
    local_54 = 0x109;
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar3 = std::operator<<(poVar3,"Bad top control ");
    pAVar2 = Am_Object::Get(cmd,0x169,0);
    iVar1 = Am_Value::operator_cast_to_int(pAVar2);
    this = (void *)std::ostream::operator<<(poVar3,iVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  Am_Object::Get_Object(&local_60,(Am_Slot_Key)&local_18,(ulong)Am_SHOW_LOC_OBJ);
  Am_Object::Set(&local_60,0x65,local_54,0);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_top_object_offset, (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  loc_values->top_control = win.Get_Object(Am_TOP_HOW).Get(Am_VALUE);
  int val = loc_values->top_object_offset;
  win.Get_Object(Am_TOP_AMOUNT_WIDGET).Set(Am_VALUE, val);
  set_ref_grey(win, false);
  int y;
  switch ((int)cmd.Get(Am_VALUE)) {
  case am_change_offset_top_outside:
    y = REF_OBJ_TOP - SHOW_LOC_OBJ_SIZE - 1;
    break;
  case am_change_offset_top_inside:
    y = REF_OBJ_TOP + SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_bottom_inside:
    y = REF_OBJ_TOP + REF_OBJ_SIZE - SHOW_LOC_OBJ_SIZE - SHOW_LOC_OBJ_OFFSET;
    break;
  case am_change_offset_bottom_outside:
    y = REF_OBJ_TOP + REF_OBJ_SIZE + 1;
    break;
  default:
    Am_ERROR("Bad top control " << (int)cmd.Get(Am_VALUE));
  }
  win.Get_Object(Am_SHOW_LOC_OBJ).Set(Am_TOP, y);
}